

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_table.c
# Opt level: O0

BOOL objc_registerSmallObjectClass_np(Class class,uintptr_t mask)

{
  uintptr_t mask_local;
  Class class_local;
  
  if ((mask & 7) == mask) {
    if (SmallObjectClasses[mask] == (Class)0x0) {
      SmallObjectClasses[mask] = class;
      class_local._7_1_ = '\x01';
    }
    else {
      class_local._7_1_ = '\0';
    }
  }
  else {
    class_local._7_1_ = '\0';
  }
  return class_local._7_1_;
}

Assistant:

BOOL objc_registerSmallObjectClass_np(Class class, uintptr_t mask)
{
	if ((mask & OBJC_SMALL_OBJECT_MASK) != mask)
	{
		return NO;
	}
	if (sizeof(void*) == 4)
	{
		if (Nil == SmallObjectClasses[0])
		{
			SmallObjectClasses[0] = class;
			return YES;
		}
		return NO;
	}
	if (Nil != SmallObjectClasses[mask])
	{
		return NO;
	}
	SmallObjectClasses[mask] = class;
	return YES;
}